

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O0

void __thiscall TestClass::handlePeriodic(TestClass *this)

{
  int iVar1;
  undefined1 auStack_20 [4];
  int elapsed;
  timeval curTime;
  TestClass *this_local;
  
  curTime.tv_usec = (__suseconds_t)this;
  TimeUtils::getCurTime((timeval *)auStack_20);
  iVar1 = TimeUtils::getDifference((timeval *)auStack_20,&this->mLastTime);
  this->mPeriodElapsed = iVar1 + this->mPeriodElapsed;
  this->mPeriodCount = this->mPeriodCount + 1;
  (this->mLastTime).tv_sec = _auStack_20;
  (this->mLastTime).tv_usec = curTime.tv_sec;
  return;
}

Assistant:

void TestClass::handlePeriodic()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	struct timeval curTime;
	TimeUtils::getCurTime( &curTime );
	
	int elapsed = TimeUtils::getDifference( &curTime, &mLastTime );
	mPeriodElapsed += elapsed;
	mPeriodCount++;
	LOG_NOTICE( "Periodic elapsed is %d, total periodic is %d, total elapsed is %d\n",
				elapsed, mPeriodCount, mPeriodElapsed );
	mLastTime = curTime;
}